

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O0

int AF_AActor_A_FreezeDeathChunks
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  AActor *pAVar4;
  FState *pFVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  bool local_c3;
  FName local_c0;
  TFlags<ActorFlag4,_unsigned_int> local_bc;
  DVector3 local_b8;
  FName local_9c;
  APlayerPawn *local_98;
  AActor *head;
  FName local_74;
  double local_70;
  double zo;
  double yo;
  double xo;
  AActor *local_50;
  AActor *mo;
  int numChunks;
  int i;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_20;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_20 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                  ,0x83,
                  "int AF_AActor_A_FreezeDeathChunks(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar6 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar6 = true, (param->field_0).field_1.atag != 1)) {
    bVar6 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar6) {
    _numChunks = *(AActor **)&param->field_0;
    local_c3 = true;
    if (_numChunks != (AActor *)0x0) {
      local_c3 = DObject::IsKindOf((DObject *)_numChunks,AActor::RegistrationInfo.MyClass);
    }
    if (local_c3 != false) {
      bVar1 = TVector3<double>::isZero(&_numChunks->Vel);
      bVar6 = false;
      if (!bVar1) {
        TFlags<ActorFlag6,_unsigned_int>::operator&
                  ((TFlags<ActorFlag6,_unsigned_int> *)((long)&xo + 4),
                   (int)_numChunks + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR)
                  );
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&xo + 4));
        bVar6 = uVar2 == 0;
      }
      if (bVar6) {
        _numChunks->tics = 0x69;
      }
      else {
        TVector3<double>::Zero(&_numChunks->Vel);
        pAVar4 = _numChunks;
        FSoundID::FSoundID((FSoundID *)&xo,"misc/icebreak");
        S_Sound(pAVar4,4,(FSoundID *)&xo,1.0,1.0);
        mo._0_4_ = MAX<int>(4,(int)(_numChunks->radius * _numChunks->Height) / 0x20);
        iVar3 = FRandom::Random2(&pr_freeze);
        mo._4_4_ = iVar3 % ((int)mo / 4);
        for (mo._4_4_ = MAX<int>(0x18,(int)mo + mo._4_4_); -1 < mo._4_4_; mo._4_4_ = mo._4_4_ + -1)
        {
          iVar3 = FRandom::operator()(&pr_freeze);
          yo = ((double)(iVar3 + -0x80) * _numChunks->radius) / 128.0;
          iVar3 = FRandom::operator()(&pr_freeze);
          zo = ((double)(iVar3 + -0x80) * _numChunks->radius) / 128.0;
          iVar3 = FRandom::operator()(&pr_freeze);
          local_70 = ((double)iVar3 * _numChunks->Height) / 255.0;
          FName::FName(&local_74,"IceChunk");
          AActor::Vec3Offset((DVector3 *)&head,_numChunks,yo,zo,local_70,false);
          pAVar4 = Spawn(&local_74,(DVector3 *)&head,ALLOW_REPLACE);
          local_50 = pAVar4;
          if (pAVar4 != (AActor *)0x0) {
            pFVar5 = pAVar4->SpawnState;
            iVar3 = FRandom::operator()(&pr_freeze);
            AActor::SetState(pAVar4,pFVar5 + iVar3 % 3,false);
            iVar3 = FRandom::Random2(&pr_freeze);
            (local_50->Vel).X = (double)iVar3 / 128.0;
            iVar3 = FRandom::Random2(&pr_freeze);
            (local_50->Vel).Y = (double)iVar3 / 128.0;
            dVar7 = AActor::Z(local_50);
            dVar8 = AActor::Z(_numChunks);
            (local_50->Vel).Z = ((dVar7 - dVar8) / _numChunks->Height) * 4.0;
            local_50->RenderStyle = _numChunks->RenderStyle;
            local_50->Alpha = _numChunks->Alpha;
          }
        }
        if (_numChunks->player != (player_t *)0x0) {
          FName::FName(&local_9c,"IceChunkHead");
          AActor::PosPlusZ(&local_b8,_numChunks,_numChunks->player->mo->ViewHeight);
          local_98 = (APlayerPawn *)Spawn(&local_9c,&local_b8,ALLOW_REPLACE);
          if (local_98 != (APlayerPawn *)0x0) {
            iVar3 = FRandom::Random2(&pr_freeze);
            (local_98->super_AActor).Vel.X = (double)iVar3 / 128.0;
            iVar3 = FRandom::Random2(&pr_freeze);
            (local_98->super_AActor).Vel.Y = (double)iVar3 / 128.0;
            dVar7 = AActor::Z(local_50);
            dVar8 = AActor::Z(_numChunks);
            (local_98->super_AActor).Vel.Z = ((dVar7 - dVar8) / _numChunks->Height) * 4.0;
            (local_98->super_AActor).health = _numChunks->health;
            TAngle<double>::operator=
                      (&(local_98->super_AActor).Angles.Yaw,&(_numChunks->Angles).Yaw);
            bVar6 = DObject::IsKindOf((DObject *)local_98,APlayerPawn::RegistrationInfo.MyClass);
            if (bVar6) {
              *(player_t **)(&(local_98->super_AActor).super_DThinker + 10) = _numChunks->player;
              (*(player_t **)(&(local_98->super_AActor).super_DThinker + 10))->mo = local_98;
              _numChunks->player = (player_t *)0x0;
              AActor::ObtainInventory(&local_98->super_AActor,_numChunks);
            }
            TAngle<double>::operator=(&(local_98->super_AActor).Angles.Pitch,0.0);
            (local_98->super_AActor).RenderStyle = _numChunks->RenderStyle;
            (local_98->super_AActor).Alpha = _numChunks->Alpha;
            bVar6 = TObjPtr<AActor>::operator==
                              (&((local_98->super_AActor).player)->camera,_numChunks);
            if (bVar6) {
              TObjPtr<AActor>::operator=
                        (&((local_98->super_AActor).player)->camera,&local_98->super_AActor);
            }
          }
        }
        TFlags<ActorFlag4,_unsigned_int>::operator&
                  (&local_bc,
                   (int)_numChunks +
                   (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_bc);
        if (uVar2 != 0) {
          A_BossDeath(_numChunks);
        }
        A_Unblock(_numChunks,true);
        pAVar4 = _numChunks;
        FName::FName(&local_c0,NAME_Null);
        pFVar5 = AActor::FindState(pAVar4,&local_c0);
        AActor::SetState(pAVar4,pFVar5,false);
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                  ,0x83,
                  "int AF_AActor_A_FreezeDeathChunks(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                ,0x83,
                "int AF_AActor_A_FreezeDeathChunks(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeathChunks)
{
	PARAM_SELF_PROLOGUE(AActor);

	int i;
	int numChunks;
	AActor *mo;
	
	if (!self->Vel.isZero() && !(self->flags6 & MF6_SHATTERING))
	{
		self->tics = 3*TICRATE;
		return 0;
	}
	self->Vel.Zero();
	S_Sound (self, CHAN_BODY, "misc/icebreak", 1, ATTN_NORM);

	// [RH] In Hexen, this creates a random number of shards (range [24,56])
	// with no relation to the size of the self shattering. I think it should
	// base the number of shards on the size of the dead thing, so bigger
	// things break up into more shards than smaller things.
	// An actor with radius 20 and height 64 creates ~40 chunks.
	numChunks = MAX<int>(4, int(self->radius * self->Height)/32);
	i = (pr_freeze.Random2()) % (numChunks/4);
	for (i = MAX (24, numChunks + i); i >= 0; i--)
	{
		double xo = (pr_freeze() - 128)*self->radius / 128;
		double yo = (pr_freeze() - 128)*self->radius / 128;
		double zo = (pr_freeze()*self->Height / 255);

		mo = Spawn("IceChunk", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->SetState (mo->SpawnState + (pr_freeze()%3));
			mo->Vel.X = pr_freeze.Random2() / 128.;
			mo->Vel.Y = pr_freeze.Random2() / 128.;
			mo->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;
			mo->RenderStyle = self->RenderStyle;
			mo->Alpha = self->Alpha;
		}
	}
	if (self->player)
	{ // attach the player's view to a chunk of ice
		AActor *head = Spawn("IceChunkHead", self->PosPlusZ(self->player->mo->ViewHeight), ALLOW_REPLACE);
		if (head != NULL)
		{
			head->Vel.X = pr_freeze.Random2() / 128.;
			head->Vel.Y = pr_freeze.Random2() / 128.;
			head->Vel.Z = (mo->Z() - self->Z()) / self->Height * 4;

			head->health = self->health;
			head->Angles.Yaw = self->Angles.Yaw;
			if (head->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
			{
				head->player = self->player;
				head->player->mo = static_cast<APlayerPawn*>(head);
				self->player = NULL;
				head->ObtainInventory (self);
			}
			head->Angles.Pitch = 0.;
			head->RenderStyle = self->RenderStyle;
			head->Alpha = self->Alpha;
			if (head->player->camera == self)
			{
				head->player->camera = head;
			}
		}
	}

	// [RH] Do some stuff to make this more useful outside Hexen
	if (self->flags4 & MF4_BOSSDEATH)
	{
		A_BossDeath(self);
	}
	A_Unblock(self, true);

	self->SetState(self->FindState(NAME_Null));
	return 0;
}